

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nonlinearsolver.c
# Opt level: O0

void SUNNonlinSolFreeEmpty(SUNNonlinearSolver NLS)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    *(undefined8 *)((long)in_RDI + 8) = 0;
    free(in_RDI);
  }
  return;
}

Assistant:

void SUNNonlinSolFreeEmpty(SUNNonlinearSolver NLS)
{
  if (NLS == NULL)  return;

  /* free non-NULL ops structure */
  if (NLS->ops)  free(NLS->ops);
  NLS->ops = NULL;

  /* free overall N_Vector object and return */
  free(NLS);
  return;
}